

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O3

void Assimp::ZipArchiveIOSystem::Implement::SimplifyFilename(string *filename)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  while( true ) {
    lVar2 = std::__cxx11::string::find((char)filename,0x5c);
    if (lVar2 == -1) break;
    (filename->_M_dataplus)._M_p[lVar2] = '/';
  }
  lVar2 = std::__cxx11::string::find_first_not_of((char *)filename,0x7a3cf8,0);
  if (lVar2 != 0) {
    std::__cxx11::string::erase((ulong)filename,0);
  }
  if ((SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_),
     iVar1 != 0)) {
    SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_._M_dataplus._M_p =
         (pointer)&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_,"/../","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_);
  }
  uVar3 = std::__cxx11::string::find
                    ((char *)filename,
                     (ulong)SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_._M_dataplus
                            ._M_p,0);
  while (uVar3 != 0xffffffffffffffff) {
    uVar4 = std::__cxx11::string::rfind((char)filename,0x2f);
    if (uVar4 == uVar3) {
      uVar4 = 0;
    }
    std::__cxx11::string::erase((ulong)filename,uVar4);
    uVar3 = std::__cxx11::string::find
                      ((char *)filename,
                       (ulong)SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_.
                              _M_dataplus._M_p,0);
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::SimplifyFilename(std::string& filename)
    {
        ReplaceAllChar(filename, '\\', '/');

        // Remove all . and / from the beginning of the path
        size_t pos = filename.find_first_not_of("./");
        if (pos != 0)
            filename.erase(0, pos);

        // Simplify "my/folder/../file.png" constructions, if any
        static const std::string relative("/../");
        const size_t relsize = relative.size() - 1;
        pos = filename.find(relative);
        while (pos != std::string::npos)
        {
            // Previous slash
            size_t prevpos = filename.rfind('/', pos - 1);
            if (prevpos == pos)
                filename.erase(0, pos + relative.size());
            else
                filename.erase(prevpos, pos + relsize - prevpos);

            pos = filename.find(relative);
        }
    }